

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O1

uint64_t slang::detail::hashing::hash(void *key,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  if (len < 0x11) {
    uVar15 = 0xa0761d6478bd642f;
    if (len < 4) {
      if (len == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = (ulong)*(byte *)((long)key + (len - 1)) |
                 (ulong)((uint)*(byte *)((long)key + (len >> 1)) << 8 | (uint)*key << 0x10);
      }
      uVar14 = 0;
    }
    else {
      uVar14 = (ulong)((uint)(len >> 1) & 0xc);
      uVar16 = CONCAT44(*key,*(undefined4 *)((long)key + uVar14));
      puVar13 = (undefined4 *)((long)key + (len - 4));
      uVar14 = CONCAT44(*puVar13,*(undefined4 *)((long)puVar13 - uVar14));
    }
  }
  else {
    uVar15 = 0xa0761d6478bd642f;
    uVar14 = len;
    if (0x30 < len) {
      uVar16 = 0xa0761d6478bd642f;
      uVar17 = 0xa0761d6478bd642f;
      do {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar15 ^ *(ulong *)((long)key + 8);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *key ^ 0xe7037ed1a0b428db;
        uVar15 = SUB168(auVar4 * auVar10,8) ^ SUB168(auVar4 * auVar10,0);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar16 ^ *(ulong *)((long)key + 0x18);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)((long)key + 0x10) ^ 0x8ebc6af09c88c6e3;
        uVar16 = SUB168(auVar5 * auVar11,8) ^ SUB168(auVar5 * auVar11,0);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar17 ^ *(ulong *)((long)key + 0x28);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)((long)key + 0x20) ^ 0x589965cc75374cc3;
        uVar17 = SUB168(auVar6 * auVar12,8) ^ SUB168(auVar6 * auVar12,0);
        key = (void *)((long)key + 0x30);
        uVar14 = uVar14 - 0x30;
      } while (0x30 < uVar14);
      uVar15 = uVar16 ^ uVar15 ^ uVar17;
    }
    for (; 0x10 < uVar14; uVar14 = uVar14 - 0x10) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar15 ^ *(ulong *)((long)key + 8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *key ^ 0xe7037ed1a0b428db;
      uVar15 = SUB168(auVar3 * auVar9,8) ^ SUB168(auVar3 * auVar9,0);
      key = (void *)((long)key + 0x10);
    }
    uVar16 = *(ulong *)((long)key + (uVar14 - 0x10));
    uVar14 = *(ulong *)((long)key + (uVar14 - 8));
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar15 ^ uVar14;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar16 ^ 0xe7037ed1a0b428db;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(auVar1 * auVar7,0) ^ SUB168(auVar1 * auVar7,8);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = len ^ 0xe7037ed1a0b428db;
  return SUB168(auVar2 * auVar8,0) ^ SUB168(auVar2 * auVar8,8);
}

Assistant:

[[maybe_unused]] [[nodiscard]] static inline uint64_t hash(void const* key, size_t len) {
    static constexpr auto secret = std::array{UINT64_C(0xa0761d6478bd642f),
                                              UINT64_C(0xe7037ed1a0b428db),
                                              UINT64_C(0x8ebc6af09c88c6e3),
                                              UINT64_C(0x589965cc75374cc3)};

    auto const* p = static_cast<uint8_t const*>(key);
    uint64_t seed = secret[0];
    uint64_t a{};
    uint64_t b{};
    if (len <= 16) [[likely]] {
        if (len >= 4) [[likely]] {
            a = (r4(p) << 32U) | r4(p + ((len >> 3U) << 2U));
            b = (r4(p + len - 4) << 32U) | r4(p + len - 4 - ((len >> 3U) << 2U));
        }
        else if (len > 0) [[likely]] {
            a = r3(p, len);
            b = 0;
        }
        else {
            a = 0;
            b = 0;
        }
    }
    else {
        size_t i = len;
        if (i > 48) [[unlikely]] {
            uint64_t see1 = seed;
            uint64_t see2 = seed;
            do
                [[likely]] {
                    seed = mix(r8(p) ^ secret[1], r8(p + 8) ^ seed);
                    see1 = mix(r8(p + 16) ^ secret[2], r8(p + 24) ^ see1);
                    see2 = mix(r8(p + 32) ^ secret[3], r8(p + 40) ^ see2);
                    p += 48;
                    i -= 48;
                }
            while (i > 48);
            seed ^= see1 ^ see2;
        }
        while (i > 16) [[unlikely]] {
            seed = mix(r8(p) ^ secret[1], r8(p + 8) ^ seed);
            i -= 16;
            p += 16;
        }
        a = r8(p + i - 16);
        b = r8(p + i - 8);
    }

    return mix(secret[1] ^ len, mix(a ^ secret[1], b ^ seed));
}